

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_map.h
# Opt level: O2

pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>::iterator,_bool>
* __thiscall
absl::lts_20250127::container_internal::
raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,bool>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,bool>>>
::try_emplace_impl<std::basic_string_view<char,std::char_traits<char>>const&>
          (pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>::iterator,_bool>
           *__return_storage_ptr__,
          raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,bool>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,bool>>>
          *this,basic_string_view<char,_std::char_traits<char>_> *k)

{
  tuple<> local_21;
  tuple<const_std::basic_string_view<char,_std::char_traits<char>_>_&> local_20;
  
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,bool>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,bool>>>
  ::find_or_prepare_insert<std::basic_string_view<char,std::char_traits<char>>>
            (__return_storage_ptr__,
             (raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,bool>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,bool>>>
              *)this,k);
  if (__return_storage_ptr__->second == true) {
    local_20.super__Tuple_impl<0UL,_const_std::basic_string_view<char,_std::char_traits<char>_>_&>.
    super__Head_base<0UL,_const_std::basic_string_view<char,_std::char_traits<char>_>_&,_false>.
    _M_head_impl = (_Tuple_impl<0UL,_const_std::basic_string_view<char,_std::char_traits<char>_>_&>)
                   (_Tuple_impl<0UL,_const_std::basic_string_view<char,_std::char_traits<char>_>_&>)
                   k;
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,bool>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,bool>>>
    ::
    emplace_at<std::piecewise_construct_t_const&,std::tuple<std::basic_string_view<char,std::char_traits<char>>const&>,std::tuple<>>
              ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,bool>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,bool>>>
                *)this,__return_storage_ptr__->first,
               (piecewise_construct_t *)&std::piecewise_construct,&local_20,&local_21);
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> try_emplace_impl(K&& k, Args&&... args)
      ABSL_ATTRIBUTE_LIFETIME_BOUND {
    auto res = this->find_or_prepare_insert(k);
    if (res.second) {
      this->emplace_at(res.first, std::piecewise_construct,
                       std::forward_as_tuple(std::forward<K>(k)),
                       std::forward_as_tuple(std::forward<Args>(args)...));
    }
    return res;
  }